

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<long,long,long,duckdb::BinaryLambdaWrapper,bool,long(*)(long,long)>
               (long *ldata,long *rdata,long *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,_func_long_long_long *fun)

{
  bool bVar1;
  long lVar2;
  idx_t iVar3;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  long rentry_1;
  long lentry_1;
  idx_t i_1;
  long rentry;
  long lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  ValidityMask *in_stack_ffffffffffffff78;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  long left;
  _func_long_long_long *in_stack_ffffffffffffff90;
  ulong local_60;
  ulong local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_60 = 0; local_60 < in_R9; local_60 = local_60 + 1) {
      lVar2 = in_RDI;
      SelectionVector::get_index(in_RCX,local_60);
      left = in_RSI;
      iVar3 = SelectionVector::get_index(in_R8,local_60);
      lVar2 = BinaryLambdaWrapper::Operation<long(*)(long,long),bool,long,long,long>
                        (*(_func_long_long_long **)(left + iVar3 * 8),left,lVar2,
                         in_stack_ffffffffffffff78,0x4e29d1);
      *(long *)(in_RDX + local_60 * 8) = lVar2;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_R9; local_38 = local_38 + 1) {
      SelectionVector::get_index(in_RCX,local_38);
      SelectionVector::get_index(in_R8,local_38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff88,(idx_t)in_stack_ffffffffffffff80);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff88,(idx_t)in_stack_ffffffffffffff80), bVar1)) {
        lVar2 = BinaryLambdaWrapper::Operation<long(*)(long,long),bool,long,long,long>
                          (in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88,
                           (long)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0x4e28fe);
        *(long *)(in_RDX + local_38 * 8) = lVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}